

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  pointer pcVar1;
  cmake *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  PolicyID id;
  _Alloc_hider _Var8;
  pointer pbVar9;
  _Hash_node_base *p_Var10;
  string orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string dirs;
  ios_base local_2b0 [264];
  ostringstream w;
  ios_base local_138 [264];
  
  PVar3 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0019,false);
  if (PVar3 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"INCLUDE_DIRECTORIES","");
    pcVar5 = GetProperty(this,&dirs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    bVar2 = mightExpandVariablesCMP0019(pcVar5);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dirs,pcVar5,(allocator<char> *)&orig);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar3 == WARN) && (iVar4 = std::__cxx11::string::compare((char *)&dirs), iVar4 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)&orig + (int)*(undefined8 *)(_w + -0x18) + 0x1d0);
        }
        else {
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,pcVar5,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"as\n",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      orig._M_dataplus._M_p = (pointer)&orig.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&orig,"INCLUDE_DIRECTORIES","");
      SetProperty(this,&orig,dirs._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var10 = (this->Targets)._M_h._M_before_begin._M_nxt;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      do {
        if (((ulong)p_Var10[0x3a]._M_nxt & 0xfffffffe) != 6) {
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"INCLUDE_DIRECTORIES","");
          pcVar5 = cmTarget::GetProperty((cmTarget *)(p_Var10 + 5),&dirs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs._M_dataplus._M_p != &dirs.field_2) {
            operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
          bVar2 = mightExpandVariablesCMP0019(pcVar5);
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dirs,pcVar5,(allocator<char> *)&orig);
            ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
            if ((PVar3 == WARN) &&
               (iVar4 = std::__cxx11::string::compare((char *)&dirs), iVar4 != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated target ",0x11);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,(char *)p_Var10[0x1d]._M_nxt,
                                  (long)p_Var10[0x1e]._M_nxt);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," INCLUDE_DIRECTORIES\n",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
              }
              else {
                sVar6 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,dirs._M_dataplus._M_p,dirs._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            }
            orig._M_dataplus._M_p = (pointer)&orig.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&orig,"INCLUDE_DIRECTORIES","");
            cmTarget::SetProperty((cmTarget *)(p_Var10 + 5),&orig,dirs._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)orig._M_dataplus._M_p != &orig.field_2) {
              operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirs._M_dataplus._M_p != &dirs.field_2) {
              operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
            }
          }
        }
        p_Var10 = p_Var10->_M_nxt;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
    dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"LINK_DIRECTORIES","");
    pcVar5 = GetProperty(this,&dirs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar5 != (char *)0x0) && (bVar2 = mightExpandVariablesCMP0019(pcVar5), bVar2)) {
      dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,pcVar5,pcVar5 + sVar6);
      orig._M_dataplus._M_p = (pointer)&orig.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&orig,pcVar5,pcVar5 + sVar6);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar3 == WARN) &&
         ((dirs._M_string_length != orig._M_string_length ||
          ((dirs._M_string_length != 0 &&
           (iVar4 = bcmp(dirs._M_dataplus._M_p,orig._M_dataplus._M_p,dirs._M_string_length),
           iVar4 != 0)))))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&w,"Evaluated link directories\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,orig._M_dataplus._M_p,orig._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as\n",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,dirs._M_dataplus._M_p,dirs._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
    }
    dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"LINK_LIBRARIES","");
    pcVar5 = GetProperty(this,&dirs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 != (char *)0x0) {
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,pcVar5,pcVar5 + sVar6);
      cmSystemTools::ExpandListArgument(&dirs,&linkLibs,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
      if (linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar9 = linkLibs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          pcVar1 = (pbVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dirs,pcVar1,pcVar1 + pbVar9->_M_string_length);
          iVar4 = std::__cxx11::string::compare((char *)&dirs);
          if (iVar4 == 0) {
            pbVar9 = pbVar9 + 1;
            std::__cxx11::string::_M_assign((string *)&dirs);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&dirs);
            if (iVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              std::__cxx11::string::_M_assign((string *)&dirs);
            }
          }
          _Var8._M_p = dirs._M_dataplus._M_p;
          bVar2 = mightExpandVariablesCMP0019(dirs._M_dataplus._M_p);
          if (bVar2) {
            orig._M_dataplus._M_p = (pointer)&orig.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&orig,_Var8._M_p,_Var8._M_p + dirs._M_string_length);
            ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
            if ((PVar3 == WARN) &&
               ((dirs._M_string_length != orig._M_string_length ||
                ((dirs._M_string_length != 0 &&
                 (iVar4 = bcmp(dirs._M_dataplus._M_p,orig._M_dataplus._M_p,dirs._M_string_length),
                 iVar4 != 0)))))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated link library\n",0x17);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,orig._M_dataplus._M_p,orig._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,dirs._M_dataplus._M_p,dirs._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            }
            _Var8._M_p = dirs._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)orig._M_dataplus._M_p != &orig.field_2) {
              operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
              _Var8 = dirs._M_dataplus;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var8._M_p != &dirs.field_2) {
            operator_delete(_Var8._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != linkLibs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&linkLibs);
    }
    std::__cxx11::stringbuf::str();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    if (dirs._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&orig,(cmPolicies *)0x13,id);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&dirs,orig._M_dataplus._M_p,orig._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"The following variable evaluations were encountered:\n",0x35);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(char *)linkLibs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                 (long)linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      if (linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(linkLibs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((linkLibs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&orig,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs);
      std::ios_base::~ios_base(local_2b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  const char* includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (mightExpandVariablesCMP0019(includeDirs)) {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (mightExpandVariablesCMP0019(includeDirs)) {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }
  }

  if (const char* linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp)) {
      std::string d = linkDirsProp;
      std::string orig = linkDirsProp;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (const char* linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs;
    cmSystemTools::ExpandListArgument(linkLibsProp, linkLibs);

    for (std::vector<std::string>::iterator l = linkLibs.begin();
         l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized") {
        ++l;
        libName = *l;
      } else if (libName == "debug") {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           m.str(), this->Backtrace);
  }
}